

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  long lVar9;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  __m128i alVar12;
  __m128i alVar13;
  long lVar4;
  
  lVar4 = (ulong)src1_stride * 2;
  lVar3 = (ulong)src0_stride * 2;
  puVar5 = src0;
  puVar7 = src1;
  do {
    puVar6 = puVar5;
    puVar8 = puVar7;
    for (lVar9 = 0; lVar9 < w; lVar9 = lVar9 + 8) {
      uVar1 = *(ulong *)(mask + lVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar1;
      uVar2 = *(undefined8 *)(mask + lVar9 + (ulong)mask_stride);
      auVar11[0] = pavgb((char)uVar2,(char)uVar1);
      auVar11[1] = pavgb((char)((ulong)uVar2 >> 8),(char)(uVar1 >> 8));
      auVar11[2] = pavgb((char)((ulong)uVar2 >> 0x10),(char)(uVar1 >> 0x10));
      auVar11[3] = pavgb((char)((ulong)uVar2 >> 0x18),(char)(uVar1 >> 0x18));
      auVar11[4] = pavgb((char)((ulong)uVar2 >> 0x20),(char)(uVar1 >> 0x20));
      auVar11[5] = pavgb((char)((ulong)uVar2 >> 0x28),(char)(uVar1 >> 0x28));
      auVar11[6] = pavgb((char)((ulong)uVar2 >> 0x30),(char)(uVar1 >> 0x30));
      auVar11[7] = pavgb((char)((ulong)uVar2 >> 0x38),(char)(uVar1 >> 0x38));
      auVar11[8] = pavgb(0,0);
      auVar11[9] = pavgb(0,0);
      auVar11[10] = pavgb(0,0);
      auVar11[0xb] = pavgb(0,0);
      auVar11[0xc] = pavgb(0,0);
      auVar11[0xd] = pavgb(0,0);
      auVar11[0xe] = pavgb(0,0);
      auVar11[0xf] = pavgb(0,0);
      pmovzxbw(auVar10,auVar11);
      pmovsxbw(auVar11,0x4040404040404040);
      alVar12[1] = lVar3;
      alVar12[0] = (longlong)src0;
      alVar13[1] = lVar4;
      alVar13[0] = (longlong)src1;
      alVar12 = (*blend)(puVar6,puVar8,alVar12,alVar13);
      src0 = alVar12[1];
      *(undefined8 *)(dst + lVar9) = extraout_XMM0_Qa;
      *(undefined8 *)(dst + lVar9 + 4) = extraout_XMM0_Qb;
      puVar8 = puVar8 + 8;
      puVar6 = puVar6 + 8;
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    puVar7 = puVar7 + src1_stride;
    puVar5 = puVar5 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_ra_b = xx_loadl_64(mask + c);
      const __m128i v_rb_b = xx_loadl_64(mask + c + mask_stride);
      const __m128i v_a_b = _mm_avg_epu8(v_ra_b, v_rb_b);

      const __m128i v_m0_w = _mm_cvtepu8_epi16(v_a_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}